

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

void * CVodeCreate(int lmm,SUNContext sunctx)

{
  undefined4 uVar1;
  long in_RSI;
  int in_EDI;
  CVodeMem cv_mem;
  int maxord;
  long *local_8;
  
  if ((in_EDI == 1) || (in_EDI == 2)) {
    if (in_RSI == 0) {
      cvProcessError((CVodeMem)0x0,0,0x1e3,"CVodeCreate",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                     ,"sunctx = NULL illegal.");
      local_8 = (long *)0x0;
    }
    else {
      local_8 = (long *)malloc(0xa80);
      if (local_8 == (long *)0x0) {
        cvProcessError((CVodeMem)0x0,0,0x1eb,"CVodeCreate",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                       ,"Allocation of cvode_mem failed.");
        local_8 = (long *)0x0;
      }
      else {
        memset(local_8,0,0xa80);
        uVar1 = 5;
        if (in_EDI == 1) {
          uVar1 = 0xc;
        }
        *local_8 = in_RSI;
        *(int *)(local_8 + 4) = in_EDI;
        local_8[1] = 0x3cb0000000000000;
        local_8[2] = 0;
        local_8[3] = 0;
        *(undefined4 *)((long)local_8 + 0x24) = 0;
        *(undefined4 *)(local_8 + 8) = 1;
        *(undefined4 *)((long)local_8 + 0x44) = 0;
        local_8[9] = 0;
        local_8[10] = 0;
        local_8[0x10e] = 0;
        local_8[0x10f] = 0;
        *(undefined4 *)(local_8 + 0xb3) = uVar1;
        local_8[0xb4] = 500;
        *(undefined4 *)(local_8 + 0xb5) = 10;
        *(undefined4 *)(local_8 + 0x110) = 0;
        local_8[0x7b] = 0;
        local_8[0xb7] = 0;
        local_8[0xb8] = 0;
        local_8[0xba] = 0;
        local_8[0xbb] = 0x3ff8000000000000;
        local_8[0xbc] = 0x40c3880000000000;
        local_8[0xbd] = 0x4024000000000000;
        local_8[0xbe] = 0x4024000000000000;
        local_8[0xbf] = (long)&DAT_3fb999999999999a;
        local_8[0xc0] = (long)&DAT_3fb999999999999a;
        local_8[0xc1] = 0x3fc999999999999a;
        local_8[0xc2] = 0x3fd0000000000000;
        local_8[0xc3] = 10;
        *(undefined4 *)(local_8 + 0xc4) = 2;
        *(undefined4 *)(local_8 + 0x76) = 0;
        *(undefined4 *)((long)local_8 + 0x3b4) = 0;
        *(undefined4 *)((long)local_8 + 0x5ac) = 7;
        *(undefined4 *)(local_8 + 0xb6) = 10;
        local_8[0xb1] = (long)&DAT_3fb999999999999a;
        local_8[0xfd] = 0x14;
        local_8[0xfe] = 0x3fd3333333333333;
        *(undefined4 *)(local_8 + 0xf0) = 0;
        local_8[0x3f] = 0;
        *(undefined4 *)(local_8 + 0xb) = 0;
        local_8[0x132] = 0;
        local_8[0x133] = 0;
        local_8[0x134] = 0;
        local_8[0x12d] = 0;
        local_8[0x12e] = 0;
        local_8[299] = 0;
        *(undefined4 *)(local_8 + 300) = 0;
        local_8[0x139] = 0;
        *(undefined4 *)(local_8 + 0x13a) = 1;
        local_8[0x13b] = 0;
        *(undefined4 *)(local_8 + 0x13c) = 0;
        *(undefined4 *)((long)local_8 + 0x9e4) = 0;
        *(undefined4 *)((long)local_8 + 0x5c) = 0;
        local_8[0xc] = 0;
        *(undefined4 *)(local_8 + 0xd) = 0;
        *(undefined4 *)((long)local_8 + 0x6c) = 0;
        *(undefined4 *)(local_8 + 0x11) = 1;
        *(undefined4 *)((long)local_8 + 0x8c) = 0;
        local_8[0x15] = 0;
        local_8[0x13] = (long)cvSensRhsInternalDQ;
        local_8[0x14] = (long)cvSensRhs1InternalDQ;
        *(undefined4 *)(local_8 + 0x16) = 1;
        *(undefined4 *)((long)local_8 + 0xb4) = 1;
        *(undefined4 *)(local_8 + 0x1a) = 1;
        local_8[0x1b] = 0;
        local_8[0x17] = 0;
        local_8[0x18] = 0;
        local_8[0x19] = 0;
        *(undefined4 *)(local_8 + 0x1c) = 0;
        local_8[0xb2] = 0;
        local_8[0xce] = 0;
        local_8[0xd1] = 0;
        local_8[0xd4] = 0;
        *(undefined4 *)((long)local_8 + 0xe4) = 0;
        local_8[0x20] = 0;
        *(undefined4 *)(local_8 + 0x21) = 0;
        local_8[0x22] = 0;
        local_8[0x23] = 0;
        *(undefined4 *)(local_8 + 0x24) = 1;
        *(undefined4 *)((long)local_8 + 0x124) = 0;
        *(undefined4 *)(local_8 + 0x25) = 0;
        local_8[0x29] = 0;
        *(undefined4 *)(local_8 + 0x14d) = 0;
        local_8[0x14e] = 0;
        *(undefined4 *)(local_8 + 0x106) = uVar1;
        *(undefined4 *)((long)local_8 + 0x834) = uVar1;
        *(undefined4 *)(local_8 + 0x107) = uVar1;
        local_8[0xe3] = 0x60;
        local_8[0xe4] = 0x34;
        *(undefined4 *)((long)local_8 + 0x844) = 0;
        *(undefined4 *)(local_8 + 0x109) = 0;
        *(undefined4 *)((long)local_8 + 0x84c) = 0;
        *(undefined4 *)(local_8 + 0x10a) = 0;
        *(undefined4 *)((long)local_8 + 0x854) = 0;
        *(undefined4 *)(local_8 + 0x10b) = 0;
        *(undefined4 *)((long)local_8 + 0x85c) = 0;
        *(undefined4 *)(local_8 + 0x10c) = 0;
        *(undefined4 *)((long)local_8 + 0x864) = 0;
        *(undefined4 *)(local_8 + 0x10d) = 0;
        *(undefined4 *)((long)local_8 + 0x86c) = 0;
        *(undefined4 *)(local_8 + 0x14f) = 0;
        local_8[0xe5] = 0;
        *(undefined4 *)(local_8 + 0xe6) = 0;
        local_8[0xe7] = 0;
        *(undefined4 *)(local_8 + 0xe8) = 0;
        local_8[0xf1] = 0;
        local_8[0xf2] = 0;
        local_8[0xf3] = 0;
        *(undefined4 *)(local_8 + 0xf7) = 0;
        local_8[0xe9] = 0;
        *(undefined4 *)(local_8 + 0xea) = 0;
        local_8[0xf4] = 0;
        local_8[0xf5] = 0;
        local_8[0xf6] = 0;
        *(undefined4 *)((long)local_8 + 0x7bc) = 0;
        local_8[0xeb] = 0;
        *(undefined4 *)(local_8 + 0xec) = 0;
        *(undefined4 *)(local_8 + 0xee) = 0;
        *(undefined4 *)((long)local_8 + 0x764) = 0xffffffff;
      }
    }
  }
  else {
    cvProcessError((CVodeMem)0x0,0,0x1dd,"CVodeCreate",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"Illegal value for lmm. The legal values are CV_ADAMS and CV_BDF.");
    local_8 = (long *)0x0;
  }
  return local_8;
}

Assistant:

void* CVodeCreate(int lmm, SUNContext sunctx)
{
  int maxord;
  CVodeMem cv_mem;

  /* Test inputs */

  if ((lmm != CV_ADAMS) && (lmm != CV_BDF))
  {
    cvProcessError(NULL, 0, __LINE__, __func__, __FILE__, MSGCV_BAD_LMM);
    return (NULL);
  }

  if (sunctx == NULL)
  {
    cvProcessError(NULL, 0, __LINE__, __func__, __FILE__, MSGCV_NULL_SUNCTX);
    return (NULL);
  }

  cv_mem = NULL;
  cv_mem = (CVodeMem)malloc(sizeof(struct CVodeMemRec));
  if (cv_mem == NULL)
  {
    cvProcessError(NULL, 0, __LINE__, __func__, __FILE__, MSGCV_CVMEM_FAIL);
    return (NULL);
  }

  /* Zero out cv_mem */
  memset(cv_mem, 0, sizeof(struct CVodeMemRec));

  maxord = (lmm == CV_ADAMS) ? ADAMS_Q_MAX : BDF_Q_MAX;

  /* Copy input parameters into cv_mem */
  cv_mem->cv_sunctx = sunctx;
  cv_mem->cv_lmm    = lmm;

  /* Set uround */
  cv_mem->cv_uround = SUN_UNIT_ROUNDOFF;

  /* Set default values for integrator optional inputs */
  cv_mem->cv_f                = NULL;
  cv_mem->cv_user_data        = NULL;
  cv_mem->cv_itol             = CV_NN;
  cv_mem->cv_atolmin0         = SUNTRUE;
  cv_mem->cv_user_efun        = SUNFALSE;
  cv_mem->cv_efun             = NULL;
  cv_mem->cv_e_data           = NULL;
  cv_mem->cv_monitorfun       = NULL;
  cv_mem->cv_monitor_interval = 0;
  cv_mem->cv_qmax             = maxord;
  cv_mem->cv_mxstep           = MXSTEP_DEFAULT;
  cv_mem->cv_mxhnil           = MXHNIL_DEFAULT;
  cv_mem->cv_sldeton          = SUNFALSE;
  cv_mem->cv_hin              = ZERO;
  cv_mem->cv_hmin             = HMIN_DEFAULT;
  cv_mem->cv_hmax_inv         = HMAX_INV_DEFAULT;
  cv_mem->cv_eta_min_fx       = ETA_MIN_FX_DEFAULT;
  cv_mem->cv_eta_max_fx       = ETA_MAX_FX_DEFAULT;
  cv_mem->cv_eta_max_fs       = ETA_MAX_FS_DEFAULT;
  cv_mem->cv_eta_max_es       = ETA_MAX_ES_DEFAULT;
  cv_mem->cv_eta_max_gs       = ETA_MAX_GS_DEFAULT;
  cv_mem->cv_eta_min          = ETA_MIN_DEFAULT;
  cv_mem->cv_eta_min_ef       = ETA_MIN_EF_DEFAULT;
  cv_mem->cv_eta_max_ef       = ETA_MAX_EF_DEFAULT;
  cv_mem->cv_eta_cf           = ETA_CF_DEFAULT;
  cv_mem->cv_small_nst        = SMALL_NST_DEFAULT;
  cv_mem->cv_small_nef        = SMALL_NEF_DEFAULT;
  cv_mem->cv_tstopset         = SUNFALSE;
  cv_mem->cv_tstopinterp      = SUNFALSE;
  cv_mem->cv_maxnef           = MXNEF;
  cv_mem->cv_maxncf           = MXNCF;
  cv_mem->cv_nlscoef          = CORTES;
  cv_mem->cv_msbp             = MSBP_DEFAULT;
  cv_mem->cv_dgmax_lsetup     = DGMAX_LSETUP_DEFAULT;
  cv_mem->convfail            = CV_NO_FAILURES;
  cv_mem->cv_constraints      = NULL;
  cv_mem->cv_constraintsSet   = SUNFALSE;

  /* Initialize root finding variables */

  cv_mem->cv_glo     = NULL;
  cv_mem->cv_ghi     = NULL;
  cv_mem->cv_grout   = NULL;
  cv_mem->cv_iroots  = NULL;
  cv_mem->cv_rootdir = NULL;
  cv_mem->cv_gfun    = NULL;
  cv_mem->cv_nrtfn   = 0;
  cv_mem->cv_gactive = NULL;
  cv_mem->cv_mxgnull = 1;

  /* Initialize projection variables */
  cv_mem->proj_mem     = NULL;
  cv_mem->proj_enabled = SUNFALSE;
  cv_mem->proj_applied = SUNFALSE;

  /* Set default values for quad. optional inputs */

  cv_mem->cv_quadr     = SUNFALSE;
  cv_mem->cv_fQ        = NULL;
  cv_mem->cv_errconQ   = SUNFALSE;
  cv_mem->cv_itolQ     = CV_NN;
  cv_mem->cv_atolQmin0 = SUNTRUE;

  /* Set default values for sensi. optional inputs */

  cv_mem->cv_sensi     = SUNFALSE;
  cv_mem->cv_fS_data   = NULL;
  cv_mem->cv_fS        = cvSensRhsInternalDQ;
  cv_mem->cv_fS1       = cvSensRhs1InternalDQ;
  cv_mem->cv_fSDQ      = SUNTRUE;
  cv_mem->cv_ifS       = CV_ONESENS;
  cv_mem->cv_DQtype    = CV_CENTERED;
  cv_mem->cv_DQrhomax  = ZERO;
  cv_mem->cv_p         = NULL;
  cv_mem->cv_pbar      = NULL;
  cv_mem->cv_plist     = NULL;
  cv_mem->cv_errconS   = SUNFALSE;
  cv_mem->cv_ncfS1     = NULL;
  cv_mem->cv_ncfnS1    = NULL;
  cv_mem->cv_nniS1     = NULL;
  cv_mem->cv_nnfS1     = NULL;
  cv_mem->cv_itolS     = CV_NN;
  cv_mem->cv_atolSmin0 = NULL;

  /* Set default values for quad. sensi. optional inputs */

  cv_mem->cv_quadr_sensi = SUNFALSE;
  cv_mem->cv_fQS         = NULL;
  cv_mem->cv_fQS_data    = NULL;
  cv_mem->cv_fQSDQ       = SUNTRUE;
  cv_mem->cv_errconQS    = SUNFALSE;
  cv_mem->cv_itolQS      = CV_NN;
  cv_mem->cv_atolQSmin0  = NULL;

  /* Set default for ASA */

  cv_mem->cv_adj     = SUNFALSE;
  cv_mem->cv_adj_mem = NULL;

  /* Set the saved value for qmax_alloc */

  cv_mem->cv_qmax_alloc  = maxord;
  cv_mem->cv_qmax_allocQ = maxord;
  cv_mem->cv_qmax_allocS = maxord;

  /* Initialize lrw and liw */

  cv_mem->cv_lrw = 65 + 2 * L_MAX + NUM_TESTS;
  cv_mem->cv_liw = 52;

  /* No mallocs have been done yet */

  cv_mem->cv_VabstolMallocDone     = SUNFALSE;
  cv_mem->cv_MallocDone            = SUNFALSE;
  cv_mem->cv_constraintsMallocDone = SUNFALSE;

  cv_mem->cv_VabstolQMallocDone = SUNFALSE;
  cv_mem->cv_QuadMallocDone     = SUNFALSE;

  cv_mem->cv_VabstolSMallocDone = SUNFALSE;
  cv_mem->cv_SabstolSMallocDone = SUNFALSE;
  cv_mem->cv_SensMallocDone     = SUNFALSE;

  cv_mem->cv_VabstolQSMallocDone = SUNFALSE;
  cv_mem->cv_SabstolQSMallocDone = SUNFALSE;
  cv_mem->cv_QuadSensMallocDone  = SUNFALSE;

  cv_mem->cv_adjMallocDone = SUNFALSE;

  /* Initialize nonlinear solver variables */
  cv_mem->NLS    = NULL;
  cv_mem->ownNLS = SUNFALSE;

  cv_mem->NLSsim        = NULL;
  cv_mem->ownNLSsim     = SUNFALSE;
  cv_mem->zn0Sim        = NULL;
  cv_mem->ycorSim       = NULL;
  cv_mem->ewtSim        = NULL;
  cv_mem->simMallocDone = SUNFALSE;

  cv_mem->NLSstg        = NULL;
  cv_mem->ownNLSstg     = SUNFALSE;
  cv_mem->zn0Stg        = NULL;
  cv_mem->ycorStg       = NULL;
  cv_mem->ewtStg        = NULL;
  cv_mem->stgMallocDone = SUNFALSE;

  cv_mem->NLSstg1    = NULL;
  cv_mem->ownNLSstg1 = SUNFALSE;

  cv_mem->sens_solve     = SUNFALSE;
  cv_mem->sens_solve_idx = -1;

  /* Return pointer to CVODES memory block */

  return ((void*)cv_mem);
}